

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudDrv_ALSA.c
# Opt level: O2

UINT8 ALSA_Stop(void *drvObj)

{
  UINT8 UVar1;
  int iVar2;
  DRV_ALSA *drv;
  
  UVar1 = 0xd8;
  if (*(char *)((long)drvObj + 8) == '\x01') {
    *(undefined1 *)((long)drvObj + 8) = 2;
    OSThread_Join(*(OS_THREAD **)((long)drvObj + 0x30));
    OSThread_Deinit(*(OS_THREAD **)((long)drvObj + 0x30));
    *(undefined8 *)((long)drvObj + 0x30) = 0;
    if (*(char *)((long)drvObj + 0x51) != '\0') {
      snd_pcm_pause(*(undefined8 *)((long)drvObj + 0x48),0);
    }
    snd_pcm_drain(*(undefined8 *)((long)drvObj + 0x48));
    free(*(void **)((long)drvObj + 0x28));
    *(undefined8 *)((long)drvObj + 0x28) = 0;
    iVar2 = snd_pcm_close(*(undefined8 *)((long)drvObj + 0x48));
    if (iVar2 < 0) {
      UVar1 = 0xc4;
    }
    else {
      *(undefined8 *)((long)drvObj + 0x48) = 0;
      *(undefined1 *)((long)drvObj + 8) = 0;
      UVar1 = '\0';
    }
  }
  return UVar1;
}

Assistant:

UINT8 ALSA_Stop(void* drvObj)
{
	DRV_ALSA* drv = (DRV_ALSA*)drvObj;
	int retVal;
	
	if (drv->devState != 1)
		return 0xD8;	// is already stopped (or stopping)
	
	drv->devState = 2;
	
	OSThread_Join(drv->hThread);
	OSThread_Deinit(drv->hThread);	drv->hThread = NULL;
	
	if (drv->canPause)
		retVal = snd_pcm_pause(drv->hPCM, 0);
	retVal = snd_pcm_drain(drv->hPCM);
	
	free(drv->bufSpace);	drv->bufSpace = NULL;
	
	retVal = snd_pcm_close(drv->hPCM);
	if (retVal < 0)
		return 0xC4;		// close failed -- but why ???
	drv->hPCM = NULL;
	
	drv->devState = 0;
	
	return AERR_OK;
}